

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O1

int cram_dependent_data_series(cram_fd *fd,cram_block_compression_hdr *hdr,cram_slice *s)

{
  byte *pbVar1;
  cram_block *pcVar2;
  cram_block **ppcVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  uint uVar6;
  cram_map *pcVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  cram_map *pcVar11;
  long lVar12;
  bool bVar13;
  int bnum2;
  int local_54;
  cram_map *local_50;
  uint local_44;
  cram_fd *local_40;
  long local_38;
  
  uVar9 = fd->required_fields;
  if ((uVar9 == 0) || (uVar9 == 0x7fffffff)) {
    hdr->data_series = 0x7fffffff;
    if (0 < s->hdr->num_blocks) {
      lVar12 = 0;
      do {
        iVar4 = cram_uncompress_block(s->block[lVar12]);
        if (iVar4 != 0) {
          return -1;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < s->hdr->num_blocks);
    }
  }
  else {
    uVar6 = (uVar9 & 1) << 0xf;
    hdr->data_series = uVar6;
    uVar9 = fd->required_fields;
    if ((uVar9 & 2) != 0) {
      hdr->data_series = uVar6 | 1;
    }
    if ((uVar9 & 4) != 0) {
      hdr->data_series = hdr->data_series | 0x200001;
    }
    if ((uVar9 & 8) != 0) {
      *(byte *)&hdr->data_series = (byte)hdr->data_series | 3;
    }
    if ((uVar9 & 0x10) != 0) {
      pbVar1 = (byte *)((long)&hdr->data_series + 1);
      *pbVar1 = *pbVar1 | 0x20;
    }
    if ((uVar9 & 0x20) != 0) {
      hdr->data_series = hdr->data_series | 0x3c00b1d;
    }
    if ((uVar9 & 0x40) != 0) {
      hdr->data_series = hdr->data_series | 0x310021;
    }
    if ((char)uVar9 < '\0') {
      hdr->data_series = hdr->data_series | 0x120023;
    }
    if ((uVar9 >> 8 & 1) != 0) {
      hdr->data_series = hdr->data_series | 0x3fc0b3f;
    }
    if ((uVar9 >> 9 & 1) != 0) {
      hdr->data_series = hdr->data_series | 0x17c00fdf;
    }
    if ((uVar9 >> 0xb & 1) == 0) {
      fd->decode_md = 0;
    }
    if ((uVar9 >> 10 & 1) != 0) {
      hdr->data_series = hdr->data_series | 0x17c00fdf;
    }
    if ((uVar9 >> 0xb & 1) != 0) {
      hdr->data_series = hdr->data_series | 0x40005000;
    }
    if ((uVar9 >> 0xc & 1) != 0) {
      hdr->data_series = hdr->data_series | 0x1001;
    }
    iVar4 = cram_uncompress_block(*s->block);
    if (iVar4 != 0) {
      return -1;
    }
    local_40 = fd;
    __ptr = calloc((long)s->hdr->num_blocks + 1,4);
    if (__ptr == (void *)0x0) {
      return -1;
    }
    pcVar11 = (cram_map *)0x0;
    do {
      if ((hdr->data_series >> 0x16 & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series >> 0x17 & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series >> 0x18 & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((char)hdr->data_series < '\0') {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series >> 0xb & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series >> 0x19 & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series >> 10 & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series & 0x10) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series & 0x40) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series >> 0x1a & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series >> 0x1c & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x104;
      }
      if ((hdr->data_series & 0x17c00fdf) != 0) {
        hdr->data_series = hdr->data_series | 8;
      }
      if ((hdr->data_series & 4) != 0) {
        hdr->data_series = hdr->data_series | 0x100;
      }
      if ((hdr->data_series >> 8 & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x200;
      }
      if ((hdr->data_series >> 0x1e & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x4000;
      }
      if ((hdr->data_series >> 0x13 & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x100000;
      }
      if ((hdr->data_series >> 0xd & 1) != 0) {
        hdr->data_series = hdr->data_series | 1;
      }
      if ((hdr->data_series >> 10 & 1) != 0) {
        hdr->data_series = hdr->data_series | 0x200000;
      }
      if ((hdr->data_series & 0xf0020) != 0) {
        hdr->data_series = hdr->data_series | 0x100000;
      }
      if ((hdr->read_names_included == 0) && ((short)hdr->data_series < 0)) {
        hdr->data_series = hdr->data_series | 0x100020;
      }
      if ((hdr->data_series & 0x140000c0) != 0) {
        hdr->data_series = hdr->data_series | 0x100009;
      }
      local_44 = hdr->data_series;
      lVar12 = 0;
      local_50 = pcVar11;
      do {
        iVar4 = 9;
        if (((hdr->data_series >> ((uint)lVar12 & 0x1f) & 1) != 0) &&
           (hdr->codecs[cram_dependent_data_series::i_to_id[lVar12]] != (cram_codec *)0x0)) {
          iVar5 = cram_codec_to_id(hdr->codecs[cram_dependent_data_series::i_to_id[lVar12]],
                                   &local_54);
          do {
            if (iVar5 != -2) {
              if (iVar5 == -1) {
                local_50 = (cram_map *)0x1;
              }
              else if (0 < s->hdr->num_blocks) {
                lVar8 = 0;
                do {
                  pcVar2 = s->block[lVar8];
                  if ((pcVar2->content_type == EXTERNAL) && (pcVar2->content_id == iVar5)) {
                    *(undefined4 *)((long)__ptr + lVar8 * 4) = 1;
                    iVar4 = cram_uncompress_block(pcVar2);
                    if (iVar4 != 0) {
                      free(__ptr);
                      iVar4 = 1;
                      goto LAB_0011c2e0;
                    }
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 < s->hdr->num_blocks);
              }
            }
            iVar4 = 0;
          } while ((local_54 != -2) && (bVar13 = iVar5 != local_54, iVar5 = local_54, bVar13));
        }
LAB_0011c2e0:
        if ((iVar4 != 9) && (iVar4 != 0)) {
          return -1;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x1c);
      pcVar11 = local_50;
      if (((local_40->required_fields & 0x800) != 0) || ((hdr->data_series & 0x40000000) != 0)) {
        lVar12 = 0;
        do {
          pcVar7 = hdr->tag_encoding_map[lVar12];
          local_38 = lVar12;
          if (pcVar7 == (cram_map *)0x0) {
            bVar13 = true;
          }
          else {
            do {
              if (pcVar7->codec == (cram_codec *)0x0) {
                iVar4 = 0x13;
              }
              else {
                local_50 = pcVar7;
                iVar4 = cram_codec_to_id(pcVar7->codec,&local_54);
                do {
                  if (iVar4 != -2) {
                    if (iVar4 == -1) {
                      pcVar11 = (cram_map *)0x1;
                    }
                    else if (0 < s->hdr->num_blocks) {
                      lVar12 = 0;
                      do {
                        pcVar2 = s->block[lVar12];
                        if ((pcVar2->content_type == EXTERNAL) && (pcVar2->content_id == iVar4)) {
                          *(undefined4 *)((long)__ptr + lVar12 * 4) = 1;
                          iVar5 = cram_uncompress_block(pcVar2);
                          if (iVar5 != 0) {
                            free(__ptr);
                            iVar4 = 1;
                            pcVar7 = local_50;
                            goto LAB_0011c3d9;
                          }
                        }
                        lVar12 = lVar12 + 1;
                      } while (lVar12 < s->hdr->num_blocks);
                    }
                  }
                } while ((local_54 != -2) && (bVar13 = iVar4 != local_54, iVar4 = local_54, bVar13))
                ;
                iVar4 = 0;
                pcVar7 = local_50->next;
              }
LAB_0011c3d9:
              if ((iVar4 != 0x13) && (iVar4 != 0)) goto LAB_0011c3ed;
            } while (pcVar7 != (cram_map *)0x0);
            iVar4 = 0;
LAB_0011c3ed:
            bVar13 = iVar4 == 0;
          }
          if (!bVar13) {
            return -1;
          }
          lVar12 = local_38 + 1;
        } while (lVar12 != 0x20);
      }
      lVar12 = 0;
      do {
        if (hdr->codecs[cram_dependent_data_series::i_to_id[lVar12]] != (cram_codec *)0x0) {
          iVar4 = cram_codec_to_id(hdr->codecs[cram_dependent_data_series::i_to_id[lVar12]],
                                   &local_54);
          uVar9 = 1 << ((byte)lVar12 & 0x1f);
          do {
            if (iVar4 != -2) {
              if (iVar4 == -1) {
                if ((int)pcVar11 != 0) {
                  hdr->data_series = hdr->data_series | uVar9;
                }
              }
              else {
                lVar8 = (long)s->hdr->num_blocks;
                if (0 < lVar8) {
                  ppcVar3 = s->block;
                  lVar10 = 0;
                  do {
                    if (((ppcVar3[lVar10]->content_type == EXTERNAL) &&
                        (ppcVar3[lVar10]->content_id == iVar4)) &&
                       (*(int *)((long)__ptr + lVar10 * 4) != 0)) {
                      hdr->data_series = hdr->data_series | uVar9;
                    }
                    lVar10 = lVar10 + 1;
                  } while (lVar8 != lVar10);
                }
              }
            }
          } while ((local_54 != -2) && (bVar13 = iVar4 != local_54, iVar4 = local_54, bVar13));
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x1c);
      lVar12 = 0;
      do {
        pcVar7 = hdr->tag_encoding_map[lVar12];
        while (pcVar7 != (cram_map *)0x0) {
          if (pcVar7->codec != (cram_codec *)0x0) {
            iVar4 = cram_codec_to_id(pcVar7->codec,&local_54);
            do {
              if (iVar4 != -2) {
                if (iVar4 == -1) {
                  pbVar1 = (byte *)((long)&hdr->data_series + 3);
                  *pbVar1 = *pbVar1 | 0x40;
                }
                else {
                  lVar8 = (long)s->hdr->num_blocks;
                  if (0 < lVar8) {
                    ppcVar3 = s->block;
                    lVar10 = 0;
                    do {
                      if (((ppcVar3[lVar10]->content_type != FILE_HEADER) &&
                          (ppcVar3[lVar10]->content_id == iVar4)) &&
                         (*(int *)((long)__ptr + lVar10 * 4) != 0)) {
                        pbVar1 = (byte *)((long)&hdr->data_series + 3);
                        *pbVar1 = *pbVar1 | 0x40;
                      }
                      lVar10 = lVar10 + 1;
                    } while (lVar8 != lVar10);
                  }
                }
              }
            } while ((local_54 != -2) && (bVar13 = iVar4 != local_54, iVar4 = local_54, bVar13));
            pcVar7 = pcVar7->next;
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x20);
    } while (local_44 != hdr->data_series);
    free(__ptr);
  }
  return 0;
}

Assistant:

int cram_dependent_data_series(cram_fd *fd,
			       cram_block_compression_hdr *hdr,
			       cram_slice *s) {
    int *block_used;
    int core_used = 0;
    int i;
    static int i_to_id[] = {
	DS_BF, DS_AP, DS_FP, DS_RL, DS_DL, DS_NF, DS_BA, DS_QS,
	DS_FC, DS_FN, DS_BS, DS_IN, DS_RG, DS_MQ, DS_TL, DS_RN,
	DS_NS, DS_NP, DS_TS, DS_MF, DS_CF, DS_RI, DS_RS, DS_PD,
	DS_HC, DS_SC, DS_BB, DS_QQ,
    };
    uint32_t orig_ds;

    /*
     * Set the data_series bit field based on fd->required_fields
     * contents.
     */
    if (fd->required_fields && fd->required_fields != INT_MAX) {
	hdr->data_series = 0;

	if (fd->required_fields & SAM_QNAME)
	    hdr->data_series |= CRAM_RN;

	if (fd->required_fields & SAM_FLAG)
	    hdr->data_series |= CRAM_BF;

	if (fd->required_fields & SAM_RNAME)
	    hdr->data_series |= CRAM_RI | CRAM_BF;

	if (fd->required_fields & SAM_POS)
	    hdr->data_series |= CRAM_AP | CRAM_BF;

	if (fd->required_fields & SAM_MAPQ)
	    hdr->data_series |= CRAM_MQ;

	if (fd->required_fields & SAM_CIGAR)
	    hdr->data_series |= CRAM_CIGAR;

	if (fd->required_fields & SAM_RNEXT)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_RI | CRAM_NS |CRAM_BF;

	if (fd->required_fields & SAM_PNEXT)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_AP | CRAM_NP | CRAM_BF;

	if (fd->required_fields & SAM_TLEN)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_AP | CRAM_TS |
		CRAM_BF | CRAM_MF | CRAM_RI | CRAM_CIGAR;

	if (fd->required_fields & SAM_SEQ)
	    hdr->data_series |= CRAM_SEQ;

	if (!(fd->required_fields & SAM_AUX))
	    // No easy way to get MD/NM without other tags at present
	    fd->decode_md = 0;

	if (fd->required_fields & SAM_QUAL)
	    hdr->data_series |= CRAM_SEQ;

	if (fd->required_fields & SAM_AUX)
	    hdr->data_series |= CRAM_RG | CRAM_TL | CRAM_aux;

	if (fd->required_fields & SAM_RGAUX)
	    hdr->data_series |= CRAM_RG | CRAM_BF;

	// Always uncompress CORE block
	if (cram_uncompress_block(s->block[0]))
	    return -1;
    } else {
	hdr->data_series = CRAM_ALL;

	for (i = 0; i < s->hdr->num_blocks; i++) {
	    if (cram_uncompress_block(s->block[i]))
		return -1;
	}

	return 0;
    }

    block_used = calloc(s->hdr->num_blocks+1, sizeof(int));
    if (!block_used)
	return -1;

    do {
	/*
	 * Also set data_series based on code prerequisites. Eg if we need
	 * CRAM_QS then we also need to know CRAM_RL so we know how long it
	 * is, or if we need FC/FP then we also need FN (number of features).
	 *
	 * It's not reciprocal though. We may be needing to decode FN
	 * but have no need to decode FC, FP and cigar ops.
	 */
	if (hdr->data_series & CRAM_RS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_PD)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_HC)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_QS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_IN)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_SC)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_DL)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BA)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BB)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_QQ)    hdr->data_series |= CRAM_FC|CRAM_FP;

	// cram_decode_seq() needs seq[] array
	if (hdr->data_series & (CRAM_SEQ|CRAM_CIGAR)) hdr->data_series |= CRAM_RL;

	if (hdr->data_series & CRAM_FP)    hdr->data_series |= CRAM_FC;
	if (hdr->data_series & CRAM_FC)    hdr->data_series |= CRAM_FN;
	if (hdr->data_series & CRAM_aux)   hdr->data_series |= CRAM_TL;
	if (hdr->data_series & CRAM_MF)    hdr->data_series |= CRAM_CF;
	if (hdr->data_series & CRAM_MQ)    hdr->data_series |= CRAM_BF;
	if (hdr->data_series & CRAM_BS)    hdr->data_series |= CRAM_RI;
	if (hdr->data_series & (CRAM_MF |CRAM_NS |CRAM_NP |CRAM_TS |CRAM_NF))
	    hdr->data_series |= CRAM_CF;
	if (!hdr->read_names_included && hdr->data_series & CRAM_RN)
	    hdr->data_series |= CRAM_CF | CRAM_NF;
	if (hdr->data_series & (CRAM_BA | CRAM_QS | CRAM_BB | CRAM_QQ))
	    hdr->data_series |= CRAM_BF | CRAM_CF | CRAM_RL;

	orig_ds = hdr->data_series;

	// Find which blocks are in use.
	for (i = 0; i < sizeof(i_to_id)/sizeof(*i_to_id); i++) {
	    int bnum1, bnum2, j;
	    cram_codec *c = hdr->codecs[i_to_id[i]];

	    if (!(hdr->data_series & (1<<i)))
		continue;

	    if (!c)
		continue;

	    bnum1 = cram_codec_to_id(c, &bnum2);

	    for (;;) {
		switch (bnum1) {
		case -2:
		    break;

		case -1:
		    core_used = 1;
		    break;

		default:
		    for (j = 0; j < s->hdr->num_blocks; j++) {
			if (s->block[j]->content_type == EXTERNAL &&
			    s->block[j]->content_id == bnum1) {
			    block_used[j] = 1;
			    if (cram_uncompress_block(s->block[j])) {
				free(block_used);
				return -1;
			    }
			}
		    }
		    break;
		}

		if (bnum2 == -2 || bnum1 == bnum2)
		    break;

		bnum1 = bnum2; // 2nd pass
	    }
	}

	// Tags too
	if ((fd->required_fields & SAM_AUX) ||
	    (hdr->data_series & CRAM_aux)) {
	    for (i = 0; i < CRAM_MAP_HASH; i++) {
		int bnum1, bnum2, j;
		cram_map *m = hdr->tag_encoding_map[i];

		while (m) {
		    cram_codec *c = m->codec;
		    if (!c)
			continue;

		    bnum1 = cram_codec_to_id(c, &bnum2);

		    for (;;) {
			switch (bnum1) {
			case -2:
			    break;

			case -1:
			    core_used = 1;
			    break;

			default:
			    for (j = 0; j < s->hdr->num_blocks; j++) {
				if (s->block[j]->content_type == EXTERNAL &&
				    s->block[j]->content_id == bnum1) {
				    block_used[j] = 1;
				    if (cram_uncompress_block(s->block[j])) {
					free(block_used);
					return -1;
				    }
				}
			    }
			    break;
			}

			if (bnum2 == -2 || bnum1 == bnum2)
			    break;

			bnum1 = bnum2; // 2nd pass
		    }

		    m = m->next;
		}
	    }
	}

	// We now know which blocks are in used, so repeat and find
	// which other data series need to be added.
	for (i = 0; i < sizeof(i_to_id)/sizeof(*i_to_id); i++) {
	    int bnum1, bnum2, j;
	    cram_codec *c = hdr->codecs[i_to_id[i]];

	    if (!c)
		continue;

	    bnum1 = cram_codec_to_id(c, &bnum2);

	    for (;;) {
		switch (bnum1) {
		case -2:
		    break;

		case -1:
		    if (core_used) {
			//printf(" + data series %08x:\n", 1<<i);
			hdr->data_series |= 1<<i;
		    }
		    break;

		default:
		    for (j = 0; j < s->hdr->num_blocks; j++) {
			if (s->block[j]->content_type == EXTERNAL &&
			    s->block[j]->content_id == bnum1) {
			    if (block_used[j]) {
				//printf(" + data series %08x:\n", 1<<i);
				hdr->data_series |= 1<<i;
			    }
			}
		    }
		    break;
		}

		if (bnum2 == -2 || bnum1 == bnum2)
		    break;

		bnum1 = bnum2; // 2nd pass
	    }
	}

	// Tags too
	for (i = 0; i < CRAM_MAP_HASH; i++) {
	    int bnum1, bnum2, j;
	    cram_map *m = hdr->tag_encoding_map[i];

	    while (m) {
		cram_codec *c = m->codec;
		if (!c)
		    continue;

		bnum1 = cram_codec_to_id(c, &bnum2);
		
		for (;;) {
		    switch (bnum1) {
		    case -2:
			break;

		    case -1:
			//printf(" + data series %08x:\n", CRAM_aux);
			hdr->data_series |= CRAM_aux;
			break;

		    default:
			for (j = 0; j < s->hdr->num_blocks; j++) {
			    if (s->block[j]->content_type &&
				s->block[j]->content_id == bnum1) {
				if (block_used[j]) {
				    //printf(" + data series %08x:\n",
				    //       CRAM_aux);
				    hdr->data_series |= CRAM_aux;
				}
			    }
			}
			break;
		    }

		    if (bnum2 == -2 || bnum1 == bnum2)
			break;

		    bnum1 = bnum2; // 2nd pass
		}

		m = m->next;
	    }
	}
    } while (orig_ds != hdr->data_series);

    free(block_used);
    return 0;
}